

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O0

maybe<int,_void> * __thiscall
pstore::broker::gc_watch_thread::get_pid
          (maybe<int,_void> *__return_storage_ptr__,gc_watch_thread *this,string *path)

{
  bool bVar1;
  int *value;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  string *path_local;
  gc_watch_thread *this_local;
  
  lock._8_8_ = path;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->mut_);
  bVar1 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
          ::presentl(&this->processes_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_
                    );
  if (bVar1) {
    value = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
            ::getr(&this->processes_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_);
    maybe<int,void>::maybe<int_const&,void>((maybe<int,void> *)__return_storage_ptr__,value);
  }
  else {
    memset(__return_storage_ptr__,0,8);
    maybe<int,_void>::maybe(__return_storage_ptr__);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

maybe<process_identifier> gc_watch_thread::get_pid (std::string const & path) {
            std::unique_lock<decltype (mut_)> const lock{mut_};
            if (!processes_.presentl (path)) {
                return {};
            }
            return maybe<process_identifier>{processes_.getr (path)};
        }